

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderInvariance.cpp
# Opt level: O2

void __thiscall
glcts::TessellationShaderInvarianceRule4Test::getIterationProperties
          (TessellationShaderInvarianceRule4Test *this,uint n_iteration,float *out_inner_tess_levels
          ,float *out_outer_tess_levels,bool *out_point_mode,
          _tessellation_primitive_mode *out_primitive_mode,
          _tessellation_shader_vertex_ordering *out_vertex_ordering,uint *out_result_buffer_size)

{
  _tessellation_primitive_mode primitive_mode;
  pointer p_Var1;
  undefined8 uVar2;
  uint uVar3;
  
  p_Var1 = (this->m_test_iterations).
           super__Vector_base<glcts::TessellationShaderInvarianceRule4Test::_test_iteration,_std::allocator<glcts::TessellationShaderInvarianceRule4Test::_test_iteration>_>
           ._M_impl.super__Vector_impl_data._M_start;
  *(undefined8 *)out_inner_tess_levels = *(undefined8 *)p_Var1[n_iteration].inner_tess_levels;
  uVar2 = *(undefined8 *)(p_Var1[n_iteration].outer_tess_levels + 2);
  *(undefined8 *)out_outer_tess_levels = *(undefined8 *)p_Var1[n_iteration].outer_tess_levels;
  *(undefined8 *)(out_outer_tess_levels + 2) = uVar2;
  *out_point_mode = false;
  primitive_mode = p_Var1[n_iteration].primitive_mode;
  *out_primitive_mode = primitive_mode;
  *out_vertex_ordering = TESSELLATION_SHADER_VERTEX_ORDERING_CCW;
  if (out_result_buffer_size != (uint *)0x0) {
    uVar3 = TessellationShaderUtils::getAmountOfVerticesGeneratedByTessellator
                      ((this->super_TessellationShaderInvarianceBaseTest).m_utils_ptr,primitive_mode
                       ,out_inner_tess_levels,out_outer_tess_levels,
                       p_Var1[n_iteration].vertex_spacing,false);
    *out_result_buffer_size = uVar3;
    p_Var1[n_iteration].n_vertices = uVar3;
    *out_result_buffer_size = *out_result_buffer_size * 0xc;
  }
  return;
}

Assistant:

void TessellationShaderInvarianceRule4Test::getIterationProperties(
	unsigned int n_iteration, float* out_inner_tess_levels, float* out_outer_tess_levels, bool* out_point_mode,
	_tessellation_primitive_mode* out_primitive_mode, _tessellation_shader_vertex_ordering* out_vertex_ordering,
	unsigned int* out_result_buffer_size)
{
	DE_ASSERT(m_test_iterations.size() > n_iteration);

	_test_iteration& test_iteration = m_test_iterations[n_iteration];

	memcpy(out_inner_tess_levels, test_iteration.inner_tess_levels, sizeof(test_iteration.inner_tess_levels));
	memcpy(out_outer_tess_levels, test_iteration.outer_tess_levels, sizeof(test_iteration.outer_tess_levels));

	*out_point_mode		 = false;
	*out_primitive_mode  = test_iteration.primitive_mode;
	*out_vertex_ordering = TESSELLATION_SHADER_VERTEX_ORDERING_CCW;

	if (out_result_buffer_size != DE_NULL)
	{
		*out_result_buffer_size = m_utils_ptr->getAmountOfVerticesGeneratedByTessellator(
			*out_primitive_mode, out_inner_tess_levels, out_outer_tess_levels, test_iteration.vertex_spacing,
			*out_point_mode);
		test_iteration.n_vertices = *out_result_buffer_size;
		*out_result_buffer_size =
			static_cast<unsigned int>(*out_result_buffer_size * 3 /* components */ * sizeof(float));

		DE_ASSERT(*out_result_buffer_size != 0);
	}
}